

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

bool __thiscall
icu_63::number::impl::NumberStringBuilder::contentEquals
          (NumberStringBuilder *this,NumberStringBuilder *other)

{
  char16_t cVar1;
  char16_t cVar2;
  Field FVar3;
  Field FVar4;
  int local_24;
  int32_t i;
  NumberStringBuilder *other_local;
  NumberStringBuilder *this_local;
  
  if (this->fLength == other->fLength) {
    for (local_24 = 0; local_24 < this->fLength; local_24 = local_24 + 1) {
      cVar1 = charAt(this,local_24);
      cVar2 = charAt(other,local_24);
      if (cVar1 != cVar2) {
        return false;
      }
      FVar3 = fieldAt(this,local_24);
      FVar4 = fieldAt(other,local_24);
      if (FVar3 != FVar4) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool NumberStringBuilder::contentEquals(const NumberStringBuilder &other) const {
    if (fLength != other.fLength) {
        return false;
    }
    for (int32_t i = 0; i < fLength; i++) {
        if (charAt(i) != other.charAt(i) || fieldAt(i) != other.fieldAt(i)) {
            return false;
        }
    }
    return true;
}